

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O0

vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> * __thiscall
ram::MinimizerEngine::Minimize
          (vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
           *__return_storage_ptr__,MinimizerEngine *this,
          unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *sequence,
          bool minhash)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  pointer pNVar4;
  uint64_t uVar5;
  pointer pKVar6;
  reference pvVar7;
  pointer pKVar8;
  iterator iVar9;
  iterator iVar10;
  ulong local_128;
  iterator local_120;
  undefined1 local_100 [8];
  iterator it;
  uint64_t c;
  uint32_t i;
  uint64_t is_stored;
  uint64_t id;
  uint64_t reverse_minimizer;
  uint64_t minimizer;
  uint64_t shift;
  anon_class_8_1_722fcd2e window_update;
  anon_class_8_1_722fcd2e window_add;
  deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> window;
  anon_class_8_1_898eb3ea hash;
  uint64_t mask;
  bool minhash_local;
  unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *sequence_local;
  MinimizerEngine *this_local;
  vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *dst;
  
  pNVar4 = std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>::
           operator->(sequence);
  if (pNVar4->inflated_len < this->k_) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::vector
              (__return_storage_ptr__);
  }
  else {
    hash.mask = (uint64_t *)((1L << ((byte)(this->k_ << 1) & 0x3f)) + -1);
    window.
    super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)&hash;
    std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::deque
              ((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)
               &window_add);
    window_update.window =
         (deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)
         &window_add;
    shift = (uint64_t)&window_add;
    uVar1 = this->k_;
    reverse_minimizer = 0;
    id = 0;
    pNVar4 = std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>::
             operator->(sequence);
    uVar2 = pNVar4->id;
    std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::vector
              (__return_storage_ptr__);
    for (c._0_4_ = 0;
        pNVar4 = std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>::
                 operator->(sequence), (uint)c < pNVar4->inflated_len; c._0_4_ = (uint)c + 1) {
      pNVar4 = std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>::
               operator->(sequence);
      uVar5 = biosoup::NucleicAcid::Code(pNVar4,(uint)c);
      reverse_minimizer = (reverse_minimizer << 2 | uVar5) & (ulong)hash.mask;
      id = id >> 2 | (uVar5 ^ 3) << (((char)uVar1 + -1) * '\x02' & 0x3fU);
      if (this->k_ - 1 <= (uint)c) {
        if (reverse_minimizer < id) {
          uVar5 = Minimize::anon_class_8_1_898eb3ea::operator()
                            ((anon_class_8_1_898eb3ea *)
                             &window.
                              super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,reverse_minimizer);
          Minimize::anon_class_8_1_722fcd2e::operator()
                    (&window_update,uVar5,(ulong)(((uint)c - this->k_) * 2 + 2));
        }
        else if (id < reverse_minimizer) {
          uVar5 = Minimize::anon_class_8_1_898eb3ea::operator()
                            ((anon_class_8_1_898eb3ea *)
                             &window.
                              super__Deque_base<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,id);
          Minimize::anon_class_8_1_722fcd2e::operator()
                    (&window_update,uVar5,(ulong)(((uint)c - this->k_) * 2 + 3));
        }
      }
      if (this->k_ + (this->w_ - 2) <= (uint)c) {
        std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::begin
                  ((iterator *)local_100,
                   (deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *
                   )&window_add);
        while( true ) {
          std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::end
                    (&local_120,
                     (deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                      *)&window_add);
          bVar3 = std::operator!=((_Self *)local_100,&local_120);
          if (!bVar3) break;
          pKVar6 = std::
                   _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                   ::operator->((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                                 *)local_100);
          uVar5 = pKVar6->value;
          pvVar7 = std::
                   deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
                   front((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
                          *)&window_add);
          if (uVar5 != pvVar7->value) break;
          pKVar6 = std::
                   _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                   ::operator->((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                                 *)local_100);
          if ((pKVar6->origin & 0x8000000000000000) == 0) {
            pKVar6 = std::
                     _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                     ::operator->((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                                   *)local_100);
            pKVar8 = std::
                     _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                     ::operator->((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                                   *)local_100);
            local_128 = (ulong)uVar2 << 0x20 | pKVar8->origin;
            std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>::
            emplace_back<unsigned_long&,unsigned_long>
                      ((vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>
                        *)__return_storage_ptr__,&pKVar6->value,&local_128);
            pKVar6 = std::
                     _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                     ::operator->((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                                   *)local_100);
            pKVar6->origin = pKVar6->origin | 0x8000000000000000;
          }
          std::
          _Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
          ::operator++((_Deque_iterator<ram::MinimizerEngine::Kmer,_ram::MinimizerEngine::Kmer_&,_ram::MinimizerEngine::Kmer_*>
                        *)local_100);
        }
        Minimize::anon_class_8_1_722fcd2e::operator()
                  ((anon_class_8_1_722fcd2e *)&shift,((uint)c + 3) - (this->k_ + this->w_));
      }
    }
    if (minhash) {
      iVar9 = std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
              begin(__return_storage_ptr__);
      iVar10 = std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
               ::end(__return_storage_ptr__);
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                ((__normal_iterator<ram::MinimizerEngine::Kmer_*,_std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
                  )iVar9._M_current,
                 (__normal_iterator<ram::MinimizerEngine::Kmer_*,_std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
                  )iVar10._M_current,(char)this->k_ * '\x02',Kmer::SortByValue);
      pNVar4 = std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>::
               operator->(sequence);
      std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::resize
                (__return_storage_ptr__,(ulong)pNVar4->inflated_len / (ulong)this->k_);
      iVar9 = std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::
              begin(__return_storage_ptr__);
      iVar10 = std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>
               ::end(__return_storage_ptr__);
      RadixSort<__gnu_cxx::__normal_iterator<ram::MinimizerEngine::Kmer*,std::vector<ram::MinimizerEngine::Kmer,std::allocator<ram::MinimizerEngine::Kmer>>>,unsigned_long(*)(ram::MinimizerEngine::Kmer_const&)>
                ((__normal_iterator<ram::MinimizerEngine::Kmer_*,_std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
                  )iVar9._M_current,
                 (__normal_iterator<ram::MinimizerEngine::Kmer_*,_std::vector<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>_>
                  )iVar10._M_current,'@',Kmer::SortByOrigin);
    }
    std::deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_>::~deque
              ((deque<ram::MinimizerEngine::Kmer,_std::allocator<ram::MinimizerEngine::Kmer>_> *)
               &window_add);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MinimizerEngine::Kmer> MinimizerEngine::Minimize(
    const std::unique_ptr<biosoup::NucleicAcid>& sequence,
    bool minhash) const {
  if (sequence->inflated_len < k_) {
    return std::vector<Kmer>{};
  }

  std::uint64_t mask = (1ULL << (k_ * 2)) - 1;

  auto hash = [&] (std::uint64_t key) -> std::uint64_t {
    key = ((~key) + (key << 21)) & mask;
    key = key ^ (key >> 24);
    key = ((key + (key << 3)) + (key << 8)) & mask;
    key = key ^ (key >> 14);
    key = ((key + (key << 2)) + (key << 4)) & mask;
    key = key ^ (key >> 28);
    key = (key + (key << 31)) & mask;
    return key;
  };

  std::deque<Kmer> window;
  auto window_add = [&] (std::uint64_t value, std::uint64_t location) -> void {
    while (!window.empty() && window.back().value > value) {
      window.pop_back();
    }
    window.emplace_back(value, location);
  };
  auto window_update = [&] (std::uint32_t position) -> void {
    while (!window.empty() && (window.front().position()) < position) {
      window.pop_front();
    }
  };

  std::uint64_t shift = (k_ - 1) * 2;
  std::uint64_t minimizer = 0;
  std::uint64_t reverse_minimizer = 0;
  std::uint64_t id = static_cast<std::uint64_t>(sequence->id) << 32;
  std::uint64_t is_stored = 1ULL << 63;

  std::vector<Kmer> dst;

  for (std::uint32_t i = 0; i < sequence->inflated_len; ++i) {
    std::uint64_t c = sequence->Code(i);
    minimizer = ((minimizer << 2) | c) & mask;
    reverse_minimizer = (reverse_minimizer >> 2) | ((c ^ 3) << shift);
    if (i >= k_ - 1U) {
      if (minimizer < reverse_minimizer) {
        window_add(hash(minimizer), (i - (k_ - 1U)) << 1 | 0);
      } else if (minimizer > reverse_minimizer) {
        window_add(hash(reverse_minimizer), (i - (k_ - 1U)) << 1 | 1);
      }
    }
    if (i >= (k_ - 1U) + (w_ - 1U)) {
      for (auto it = window.begin(); it != window.end(); ++it) {
        if (it->value != window.front().value) {
          break;
        }
        if (it->origin & is_stored) {
          continue;
        }
        dst.emplace_back(it->value, id | it->origin);
        it->origin |= is_stored;
      }
      window_update(i - (k_ - 1U) - (w_ - 1U) + 1);
    }
  }

  if (minhash) {
    RadixSort(dst.begin(), dst.end(), k_ * 2, Kmer::SortByValue);
    dst.resize(sequence->inflated_len / k_);
    RadixSort(dst.begin(), dst.end(), 64, Kmer::SortByOrigin);
  }

  return dst;
}